

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FSingleLumpFont::CreateFontFromPic(FSingleLumpFont *this,FTextureID picnum)

{
  int iVar1;
  FTexture *this_00;
  CharData *pCVar2;
  FTexture *pic;
  FSingleLumpFont *this_local;
  FTextureID picnum_local;
  
  this_00 = FTextureManager::operator[](&TexMan,picnum);
  iVar1 = FTexture::GetHeight(this_00);
  (this->super_FFont).FontHeight = iVar1;
  iVar1 = FTexture::GetWidth(this_00);
  (this->super_FFont).SpaceWidth = iVar1;
  (this->super_FFont).GlobalKerning = 0;
  (this->super_FFont).LastChar = 0x41;
  (this->super_FFont).FirstChar = 0x41;
  pCVar2 = (CharData *)operator_new__(0x10);
  (this->super_FFont).Chars = pCVar2;
  ((this->super_FFont).Chars)->Pic = this_00;
  (this->super_FFont).ActiveColors = 0;
  return;
}

Assistant:

void FSingleLumpFont::CreateFontFromPic (FTextureID picnum)
{
	FTexture *pic = TexMan[picnum];

	FontHeight = pic->GetHeight ();
	SpaceWidth = pic->GetWidth ();
	GlobalKerning = 0;

	FirstChar = LastChar = 'A';
	Chars = new CharData[1];
	Chars->Pic = pic;

	// Only one color range. Don't bother with the others.
	ActiveColors = 0;
}